

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_processing_impl.cc
# Opt level: O0

int __thiscall webrtc::AudioProcessingImpl::StopDebugRecording(AudioProcessingImpl *this)

{
  CritScope local_20;
  CritScope cs_capture;
  CritScope cs_render;
  AudioProcessingImpl *this_local;
  
  rtc::CritScope::CritScope(&cs_capture,&this->crit_render_);
  rtc::CritScope::CritScope(&local_20,&this->crit_capture_);
  rtc::CritScope::~CritScope(&local_20);
  rtc::CritScope::~CritScope(&cs_capture);
  return -4;
}

Assistant:

int AudioProcessingImpl::StopDebugRecording() {
  // Run in a single-threaded manner.
  rtc::CritScope cs_render(&crit_render_);
  rtc::CritScope cs_capture(&crit_capture_);

#ifdef WEBRTC_AUDIOPROC_DEBUG_DUMP
  // We just return if recording hasn't started.
  if (debug_dump_.debug_file->Open()) {
    if (debug_dump_.debug_file->CloseFile() == -1) {
      return kFileError;
    }
  }
  return kNoError;
#else
  return kUnsupportedFunctionError;
#endif  // WEBRTC_AUDIOPROC_DEBUG_DUMP
}